

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O2

void __thiscall CfdLogger_SetLogger_Test::TestBody(CfdLogger_SetLogger_Test *this)

{
  bool bVar1;
  AssertHelper AStack_18;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SetLogger((void *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_10);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x23,
               "Expected: (SetLogger(nullptr)) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
    testing::internal::AssertHelper::~AssertHelper(&AStack_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_10);
  }
  return;
}

Assistant:

TEST(CfdLogger, SetLogger) {
  EXPECT_NO_THROW((SetLogger(nullptr)));
}